

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_> __thiscall
Parser::parseVariableDeclaration(Parser *this)

{
  pointer pcVar1;
  long *plVar2;
  Mark MVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined8 uVar5;
  Mark *pMVar6;
  variant_alternative_t<0UL,_variant<basic_string<char>,_double>_> *pvVar7;
  Token *pTVar8;
  VariableDeclarationNode *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  Tokenizer *in_RSI;
  TypeName type;
  Token token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  TypeName local_ac;
  undefined1 local_a8 [32];
  undefined1 local_88 [40];
  byte local_60;
  Mark local_58;
  string local_50;
  
  pMVar6 = Stream::getMark(&in_RSI->stream_);
  MVar3 = *pMVar6;
  pcVar1 = local_88 + 0x10;
  local_88._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,"Expected variable declaration!","");
  expectToken((Parser *)in_RSI,KeywordLet,(string *)local_88);
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  plVar2 = (long *)(local_a8 + 0x10);
  local_a8._0_8_ = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"Expected variable name!","");
  getToken((Token *)local_88,(Parser *)in_RSI,Identifier,(string *)local_a8);
  pvVar7 = std::get<0ul,std::__cxx11::string,double>
                     ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                       *)(local_88 + 8));
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pvVar7->_M_dataplus)._M_p;
  paVar9 = &pvVar7->field_2;
  if (paVar4 == paVar9) {
    local_50.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_50.field_2._8_4_ = *(undefined4 *)((long)&pvVar7->field_2 + 8);
    local_50.field_2._12_4_ = *(undefined4 *)((long)&pvVar7->field_2 + 0xc);
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_50._M_dataplus._M_p = (pointer)paVar4;
  }
  local_50._M_string_length = pvVar7->_M_string_length;
  (pvVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pvVar7->_M_string_length = 0;
  (pvVar7->field_2)._M_local_buf[0] = '\0';
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
    ::_S_vtable._M_arr[local_60]._M_data)
            ((anon_class_1_0_00000001 *)&local_ac,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
              *)(local_88 + 8));
  local_60 = 0xff;
  if ((long *)local_a8._0_8_ != plVar2) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_88._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"Expected colon!","");
  expectToken((Parser *)in_RSI,Colon,(string *)local_88);
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  local_ac = parseType((Parser *)in_RSI);
  local_88._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,"Expected assigment operator!","");
  expectToken((Parser *)in_RSI,Assign,(string *)local_88);
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  pTVar8 = Tokenizer::peek(in_RSI);
  local_88._0_4_ = pTVar8->type;
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)(local_88 + 8),
                    (_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)&pTVar8->value);
  local_58 = pTVar8->mark;
  if (local_88._0_4_ == Backslash) {
    parseLambda((Parser *)local_a8);
  }
  else {
    parseLogicalExpression((Parser *)local_a8);
  }
  uVar5 = local_a8._0_8_;
  local_a8._0_8_ = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"Expected semicolon!","");
  expectToken((Parser *)in_RSI,Semicolon,(string *)local_a8);
  if ((long *)local_a8._0_8_ != plVar2) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  this_00 = (VariableDeclarationNode *)operator_new(0x48);
  local_a8._0_8_ = uVar5;
  VariableDeclarationNode::VariableDeclarationNode
            (this_00,&local_50,&local_ac,
             (unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)local_a8);
  (this->tokenizer_).stream_.is_ = (istream *)this_00;
  if ((long *)local_a8._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_a8._0_8_ + 8))();
  }
  (this_00->super_StatementNode).super_Node.mark_ = MVar3;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
    ::_S_vtable._M_arr[local_60]._M_data)
            ((anon_class_1_0_00000001 *)local_a8,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
              *)(local_88 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>,_true,_true>
          )(__uniq_ptr_data<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<VariableDeclarationNode> Parser::parseVariableDeclaration()
{
  const auto mark = tokenizer_.getMark();
  expectToken(TokenType::KeywordLet, "Expected variable declaration!");
  const auto name = std::get<std::string>(getToken(TokenType::Identifier, "Expected variable name!").value);
  expectToken(TokenType::Colon, "Expected colon!");
  const auto type = parseType();
  expectToken(TokenType::Assign, "Expected assigment operator!");

  const auto token = tokenizer_.peek();
  std::unique_ptr<ExpressionNode> value = nullptr;
  if(token.type == TokenType::Backslash)
    value = parseLambda();
  else
    value = parseLogicalExpression();

  expectToken(TokenType::Semicolon, "Expected semicolon!");
  auto node = std::make_unique<VariableDeclarationNode>(name, type, std::move(value));
  node->setMark(mark);
  return node;
}